

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall dg::llvmdg::legacy::Function::dumpBlocks(Function *this,ostream *ostream)

{
  bool bVar1;
  reference ppBVar2;
  ostream *in_RSI;
  long in_RDI;
  Block *block;
  iterator __end2;
  iterator __begin2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *in_stack_ffffffffffffffc8;
  Block *this_00;
  _Self local_28;
  _Self local_20;
  long local_18;
  ostream *local_10;
  
  local_18 = in_RDI + 0x10;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppBVar2 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                        ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x21b279);
    this_00 = *ppBVar2;
    Block::dumpNode((Block *)__range2,(ostream *)__begin2._M_node);
    std::operator<<(local_10,"\n");
    std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++
              ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)this_00);
  }
  return;
}

Assistant:

void Function::dumpBlocks(std::ostream &ostream) {
    for (auto *block : blocks) {
        block->dumpNode(ostream);
        ostream << "\n";
    }
}